

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<8>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  BVH *bvh;
  size_t sVar6;
  ulong uVar7;
  void *pvVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  char cVar32;
  bool bVar33;
  int iVar34;
  AABBNodeMB4D *node1;
  uint uVar35;
  uint uVar36;
  undefined4 uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong extraout_RDX;
  ulong *puVar40;
  long lVar41;
  ulong uVar42;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar49 [16];
  NodeRef root;
  undefined1 (*pauVar43) [32];
  undefined1 auVar47 [32];
  undefined1 auVar44 [16];
  undefined1 auVar48 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 in_ZMM5 [64];
  float fVar74;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  vfloat4 a0;
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_2bc0 [32];
  undefined1 local_2b40 [32];
  undefined4 local_2b20 [8];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2b00;
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [8];
  float fStack_2a58;
  float fStack_2a54;
  float fStack_2a50;
  float fStack_2a4c;
  float fStack_2a48;
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  float local_29e0;
  float fStack_29dc;
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined4 uStack_29c4;
  float local_29c0;
  float fStack_29bc;
  float fStack_29b8;
  float fStack_29b4;
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  undefined4 uStack_29a4;
  float local_29a0;
  float fStack_299c;
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  undefined4 uStack_2984;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined4 local_28c0;
  undefined4 uStack_28bc;
  undefined4 uStack_28b8;
  undefined4 uStack_28b4;
  undefined4 uStack_28b0;
  undefined4 uStack_28ac;
  undefined4 uStack_28a8;
  undefined4 uStack_28a4;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  float local_2800;
  float fStack_27fc;
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  float fStack_27e4;
  undefined1 local_27e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [16];
  undefined1 auStack_2790 [16];
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  bvh = (BVH *)This->ptr;
  sVar6 = (bvh->root).ptr;
  if (sVar6 != 8) {
    auVar55 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar61 = *(undefined1 (*) [32])(ray + 0x100);
    auVar48 = vpcmpeqd_avx2(auVar55,(undefined1  [32])valid_i->field_0);
    auVar55 = vcmpps_avx(auVar61,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar55 = vandps_avx(auVar55,auVar48);
    uVar36 = vmovmskps_avx(auVar55);
    if (uVar36 != 0) {
      auVar44 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
      local_2aa0 = *(undefined1 (*) [32])(ray + 0x80);
      local_2a80 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_2a60 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar52._0_4_ = local_2a60._0_4_ * local_2a60._0_4_;
      auVar52._4_4_ = local_2a60._4_4_ * local_2a60._4_4_;
      auVar52._8_4_ = local_2a60._8_4_ * local_2a60._8_4_;
      auVar52._12_4_ = local_2a60._12_4_ * local_2a60._12_4_;
      auVar52._16_4_ = local_2a60._16_4_ * local_2a60._16_4_;
      auVar52._20_4_ = local_2a60._20_4_ * local_2a60._20_4_;
      auVar52._28_36_ = in_ZMM5._28_36_;
      auVar52._24_4_ = local_2a60._24_4_ * local_2a60._24_4_;
      auVar49 = vfmadd231ps_fma(auVar52._0_32_,local_2a80,local_2a80);
      auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),local_2aa0,local_2aa0);
      auVar55 = vrsqrtps_avx(ZEXT1632(auVar49));
      uVar38 = (ulong)(uVar36 & 0xff);
      fVar74 = auVar55._0_4_;
      fVar78 = auVar55._4_4_;
      fVar79 = auVar55._8_4_;
      fVar80 = auVar55._12_4_;
      fVar81 = auVar55._16_4_;
      fVar82 = auVar55._20_4_;
      fVar83 = auVar55._24_4_;
      auVar48._4_4_ = fVar78 * fVar78 * fVar78 * auVar49._4_4_ * -0.5;
      auVar48._0_4_ = fVar74 * fVar74 * fVar74 * auVar49._0_4_ * -0.5;
      auVar48._8_4_ = fVar79 * fVar79 * fVar79 * auVar49._8_4_ * -0.5;
      auVar48._12_4_ = fVar80 * fVar80 * fVar80 * auVar49._12_4_ * -0.5;
      auVar48._16_4_ = fVar81 * fVar81 * fVar81 * -0.0;
      auVar48._20_4_ = fVar82 * fVar82 * fVar82 * -0.0;
      auVar48._24_4_ = fVar83 * fVar83 * fVar83 * -0.0;
      auVar48._28_4_ = 0;
      auVar84._8_4_ = 0x3fc00000;
      auVar84._0_8_ = 0x3fc000003fc00000;
      auVar84._12_4_ = 0x3fc00000;
      auVar84._16_4_ = 0x3fc00000;
      auVar84._20_4_ = 0x3fc00000;
      auVar84._24_4_ = 0x3fc00000;
      auVar84._28_4_ = 0x3fc00000;
      auVar49 = vfmadd213ps_fma(auVar84,auVar55,auVar48);
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar49);
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar49._12_4_ = 0;
      auVar49._0_12_ = ZEXT812(0);
      auVar49 = auVar49 << 0x20;
      while (uVar38 != 0) {
        lVar41 = 0;
        for (uVar39 = uVar38; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
          lVar41 = lVar41 + 1;
        }
        uVar39 = (ulong)(uint)((int)lVar41 * 4);
        auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar39 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar39 + 0xa0)),0x1c);
        auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + uVar39 + 0xc0)),0x28);
        fVar74 = *(float *)((long)&local_27c0 + uVar39);
        auVar90._0_4_ = auVar88._0_4_ * fVar74;
        auVar90._4_4_ = auVar88._4_4_ * fVar74;
        auVar90._8_4_ = auVar88._8_4_ * fVar74;
        auVar90._12_4_ = auVar88._12_4_ * fVar74;
        auVar97 = vshufpd_avx(auVar90,auVar90,1);
        auVar88 = vmovshdup_avx(auVar90);
        auVar94 = vunpckhps_avx(auVar90,auVar49);
        auVar95 = vshufps_avx(auVar94,ZEXT416(auVar88._0_4_ ^ 0x80000000),0x41);
        auVar94._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
        auVar94._8_8_ = auVar97._8_8_ ^ auVar69._8_8_;
        auVar94 = vinsertps_avx(auVar94,auVar90,0x2a);
        auVar88 = vdpps_avx(auVar95,auVar95,0x7f);
        auVar97 = vdpps_avx(auVar94,auVar94,0x7f);
        auVar88 = vcmpps_avx(auVar97,auVar88,1);
        auVar99._0_4_ = auVar88._0_4_;
        auVar99._4_4_ = auVar99._0_4_;
        auVar99._8_4_ = auVar99._0_4_;
        auVar99._12_4_ = auVar99._0_4_;
        auVar88 = vblendvps_avx(auVar94,auVar95,auVar99);
        auVar97 = vdpps_avx(auVar88,auVar88,0x7f);
        auVar94 = vrsqrtss_avx(auVar97,auVar97);
        fVar78 = auVar94._0_4_;
        fVar78 = fVar78 * 1.5 - auVar97._0_4_ * 0.5 * fVar78 * fVar78 * fVar78;
        auVar95._0_4_ = auVar88._0_4_ * fVar78;
        auVar95._4_4_ = auVar88._4_4_ * fVar78;
        auVar95._8_4_ = auVar88._8_4_ * fVar78;
        auVar95._12_4_ = auVar88._12_4_ * fVar78;
        auVar88 = vshufps_avx(auVar95,auVar95,0xc9);
        auVar97 = vshufps_avx(auVar90,auVar90,0xc9);
        auVar100._0_4_ = auVar95._0_4_ * auVar97._0_4_;
        auVar100._4_4_ = auVar95._4_4_ * auVar97._4_4_;
        auVar100._8_4_ = auVar95._8_4_ * auVar97._8_4_;
        auVar100._12_4_ = auVar95._12_4_ * auVar97._12_4_;
        auVar88 = vfmsub231ps_fma(auVar100,auVar90,auVar88);
        auVar94 = vshufps_avx(auVar88,auVar88,0xc9);
        auVar88 = vdpps_avx(auVar94,auVar94,0x7f);
        uVar38 = uVar38 - 1 & uVar38;
        auVar97 = vrsqrtss_avx(auVar88,auVar88);
        fVar78 = auVar97._0_4_;
        fVar78 = fVar78 * 1.5 - auVar88._0_4_ * 0.5 * fVar78 * fVar78 * fVar78;
        auVar97._0_4_ = fVar78 * auVar94._0_4_;
        auVar97._4_4_ = fVar78 * auVar94._4_4_;
        auVar97._8_4_ = fVar78 * auVar94._8_4_;
        auVar97._12_4_ = fVar78 * auVar94._12_4_;
        auVar88._0_4_ = fVar74 * auVar90._0_4_;
        auVar88._4_4_ = fVar74 * auVar90._4_4_;
        auVar88._8_4_ = fVar74 * auVar90._8_4_;
        auVar88._12_4_ = fVar74 * auVar90._12_4_;
        auVar94 = vunpcklps_avx(auVar95,auVar88);
        auVar88 = vunpckhps_avx(auVar95,auVar88);
        auVar95 = vunpcklps_avx(auVar97,auVar49);
        auVar97 = vunpckhps_avx(auVar97,auVar49);
        auVar97 = vunpcklps_avx(auVar88,auVar97);
        auVar90 = vunpcklps_avx(auVar94,auVar95);
        auVar88 = vunpckhps_avx(auVar94,auVar95);
        lVar41 = lVar41 * 0x30;
        *(undefined1 (*) [16])(local_27a0 + lVar41) = auVar90;
        *(undefined1 (*) [16])(auStack_2790 + lVar41) = auVar88;
        *(undefined1 (*) [16])(auStack_2780 + lVar41) = auVar97;
      }
      local_2b00._0_4_ = *(undefined4 *)ray;
      local_2b00._4_4_ = *(undefined4 *)(ray + 4);
      local_2b00._8_4_ = *(undefined4 *)(ray + 8);
      local_2b00._12_4_ = *(undefined4 *)(ray + 0xc);
      local_2b00._16_4_ = *(undefined4 *)(ray + 0x10);
      local_2b00._20_4_ = *(undefined4 *)(ray + 0x14);
      local_2b00._24_4_ = *(undefined4 *)(ray + 0x18);
      local_2b00._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_2b00._32_4_ = *(undefined4 *)(ray + 0x20);
      local_2b00._36_4_ = *(undefined4 *)(ray + 0x24);
      local_2b00._40_4_ = *(undefined4 *)(ray + 0x28);
      local_2b00._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_2b00._48_4_ = *(undefined4 *)(ray + 0x30);
      local_2b00._52_4_ = *(undefined4 *)(ray + 0x34);
      local_2b00._56_4_ = *(undefined4 *)(ray + 0x38);
      local_2b00._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_2b00.field_0.z.field_0 = (vfloat_impl<8>)*(undefined1 (*) [32])(ray + 0x40);
      local_28a0._8_4_ = 0x7fffffff;
      local_28a0._0_8_ = 0x7fffffff7fffffff;
      local_28a0._12_4_ = 0x7fffffff;
      local_28a0._16_4_ = 0x7fffffff;
      local_28a0._20_4_ = 0x7fffffff;
      local_28a0._24_4_ = 0x7fffffff;
      local_28a0._28_4_ = 0x7fffffff;
      auVar55 = vandps_avx(local_28a0,local_2aa0);
      auVar91._8_4_ = 0x219392ef;
      auVar91._0_8_ = 0x219392ef219392ef;
      auVar91._12_4_ = 0x219392ef;
      auVar91._16_4_ = 0x219392ef;
      auVar91._20_4_ = 0x219392ef;
      auVar91._24_4_ = 0x219392ef;
      auVar91._28_4_ = 0x219392ef;
      auVar55 = vcmpps_avx(auVar55,auVar91,1);
      auVar48 = vblendvps_avx(local_2aa0,auVar91,auVar55);
      auVar55 = vandps_avx(local_28a0,local_2a80);
      auVar55 = vcmpps_avx(auVar55,auVar91,1);
      auVar84 = vblendvps_avx(local_2a80,auVar91,auVar55);
      auVar55 = vandps_avx(local_28a0,_local_2a60);
      auVar55 = vcmpps_avx(auVar55,auVar91,1);
      auVar53 = vrcpps_avx(auVar48);
      auVar55 = vblendvps_avx(_local_2a60,auVar91,auVar55);
      auVar92._8_4_ = 0x3f800000;
      auVar92._0_8_ = 0x3f8000003f800000;
      auVar92._12_4_ = 0x3f800000;
      auVar92._16_4_ = 0x3f800000;
      auVar92._20_4_ = 0x3f800000;
      auVar92._24_4_ = 0x3f800000;
      auVar92._28_4_ = 0x3f800000;
      auVar54 = vrcpps_avx(auVar84);
      auVar49 = vfnmadd213ps_fma(auVar48,auVar53,auVar92);
      auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar53,auVar53);
      auVar69 = vfnmadd213ps_fma(auVar84,auVar54,auVar92);
      auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar54,auVar54);
      auVar48 = vrcpps_avx(auVar55);
      auVar88 = vfnmadd213ps_fma(auVar55,auVar48,auVar92);
      auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar48,auVar48);
      local_2a40 = ZEXT1632(auVar49);
      local_2a20 = ZEXT1632(auVar69);
      local_2a00 = ZEXT1632(auVar88);
      local_29e0 = auVar49._0_4_ * (float)local_2b00._0_4_;
      fStack_29dc = auVar49._4_4_ * (float)local_2b00._4_4_;
      fStack_29d8 = auVar49._8_4_ * (float)local_2b00._8_4_;
      fStack_29d4 = auVar49._12_4_ * (float)local_2b00._12_4_;
      fStack_29d0 = (float)local_2b00._16_4_ * 0.0;
      fStack_29cc = (float)local_2b00._20_4_ * 0.0;
      uStack_29c4 = auVar48._28_4_;
      fStack_29c8 = (float)local_2b00._24_4_ * 0.0;
      local_29c0 = (float)local_2b00._32_4_ * auVar69._0_4_;
      fStack_29bc = (float)local_2b00._36_4_ * auVar69._4_4_;
      fStack_29b8 = (float)local_2b00._40_4_ * auVar69._8_4_;
      fStack_29b4 = (float)local_2b00._44_4_ * auVar69._12_4_;
      fStack_29b0 = (float)local_2b00._48_4_ * 0.0;
      fStack_29ac = (float)local_2b00._52_4_ * 0.0;
      fStack_29a8 = (float)local_2b00._56_4_ * 0.0;
      local_29a0 = local_2b00._64_4_ * auVar88._0_4_;
      fStack_299c = local_2b00._68_4_ * auVar88._4_4_;
      fStack_2998 = local_2b00._72_4_ * auVar88._8_4_;
      fStack_2994 = local_2b00._76_4_ * auVar88._12_4_;
      fStack_2990 = local_2b00._80_4_ * 0.0;
      fStack_298c = local_2b00._84_4_ * 0.0;
      fStack_2988 = local_2b00._88_4_ * 0.0;
      auVar48 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar55 = vcmpps_avx(local_2a40,auVar48,1);
      auVar70._8_4_ = 0x10;
      auVar70._0_8_ = 0x1000000010;
      auVar70._12_4_ = 0x10;
      auVar70._16_4_ = 0x10;
      auVar70._20_4_ = 0x10;
      auVar70._24_4_ = 0x10;
      auVar70._28_4_ = 0x10;
      local_2980 = vandps_avx(auVar55,auVar70);
      auVar53._8_4_ = 0x20;
      auVar53._0_8_ = 0x2000000020;
      auVar53._12_4_ = 0x20;
      auVar53._16_4_ = 0x20;
      auVar53._20_4_ = 0x20;
      auVar53._24_4_ = 0x20;
      auVar53._28_4_ = 0x20;
      auVar71._8_4_ = 0x30;
      auVar71._0_8_ = 0x3000000030;
      auVar71._12_4_ = 0x30;
      auVar71._16_4_ = 0x30;
      auVar71._20_4_ = 0x30;
      auVar71._24_4_ = 0x30;
      auVar71._28_4_ = 0x30;
      auVar55 = vcmpps_avx(ZEXT1632(auVar69),auVar48,5);
      local_2960 = vblendvps_avx(auVar71,auVar53,auVar55);
      auVar54._8_4_ = 0x40;
      auVar54._0_8_ = 0x4000000040;
      auVar54._12_4_ = 0x40;
      auVar54._16_4_ = 0x40;
      auVar54._20_4_ = 0x40;
      auVar54._24_4_ = 0x40;
      auVar54._28_4_ = 0x40;
      auVar64._8_4_ = 0x50;
      auVar64._0_8_ = 0x5000000050;
      auVar64._12_4_ = 0x50;
      auVar64._16_4_ = 0x50;
      auVar64._20_4_ = 0x50;
      auVar64._24_4_ = 0x50;
      auVar64._28_4_ = 0x50;
      auVar48 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar55 = vcmpps_avx(ZEXT1632(auVar88),auVar48,5);
      local_2940 = vblendvps_avx(auVar64,auVar54,auVar55);
      auVar55 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar48);
      auVar61 = vmaxps_avx(auVar61,auVar48);
      local_28e0 = vpmovsxwd_avx2(auVar44);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar102 = ZEXT3264(local_1e80);
      local_2920 = vblendvps_avx(local_1e80,auVar55,local_28e0);
      auVar55._8_4_ = 0xff800000;
      auVar55._0_8_ = 0xff800000ff800000;
      auVar55._12_4_ = 0xff800000;
      auVar55._16_4_ = 0xff800000;
      auVar55._20_4_ = 0xff800000;
      auVar55._24_4_ = 0xff800000;
      auVar55._28_4_ = 0xff800000;
      local_2900 = vblendvps_avx(auVar55,auVar61,local_28e0);
      auVar49 = vpcmpeqd_avx(local_2900._0_16_,local_2900._0_16_);
      local_2b40 = vpmovsxwd_avx2(auVar44 ^ auVar49);
      auVar52 = ZEXT3264(local_2b40);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar36 = 5;
      }
      else {
        uVar36 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      uVar38 = 0;
      puVar40 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar43 = (undefined1 (*) [32])local_1e40;
      local_2608 = sVar6;
      local_1e60 = local_2920;
      _local_28c0 = mm_lookupmask_ps._16_8_;
      _uStack_28b8 = mm_lookupmask_ps._24_8_;
      _uStack_28b0 = mm_lookupmask_ps._16_8_;
      _uStack_28a8 = mm_lookupmask_ps._24_8_;
      uStack_29a4 = local_2b00._28_4_;
      uStack_2984 = local_2b00._60_4_;
LAB_015cb6f2:
      do {
        do {
          root.ptr = puVar40[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_015cbea3;
          puVar40 = puVar40 + -1;
          pauVar43 = pauVar43 + -1;
          auVar61 = *pauVar43;
          auVar104 = ZEXT3264(auVar61);
          auVar55 = vcmpps_avx(auVar61,local_2900,1);
        } while ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar55 >> 0x7f,0) == '\0') &&
                   (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar55 >> 0xbf,0) == '\0') &&
                 (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar55[0x1f]);
        uVar37 = vmovmskps_avx(auVar55);
        uVar38 = CONCAT44((int)(uVar38 >> 0x20),uVar37);
        if (uVar36 < (uint)POPCOUNT(uVar37)) {
LAB_015cb72f:
          do {
            auVar61 = local_2b40;
            uVar39 = 0xfffffffffffffff0;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_015cbea3;
              auVar55 = vcmpps_avx(local_2900,auVar104._0_32_,6);
              if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar55 >> 0x7f,0) != '\0') ||
                    (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar55 >> 0xbf,0) != '\0') ||
                  (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar55[0x1f] < '\0') {
                bVar5 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar8 = This->leafIntersector;
                local_2b20[0] = local_28c0;
                local_2b20[1] = uStack_28bc;
                local_2b20[2] = uStack_28b8;
                local_2b20[3] = uStack_28b4;
                local_2b20[4] = uStack_28b0;
                local_2b20[5] = uStack_28ac;
                local_2b20[6] = uStack_28a8;
                local_2b20[7] = uStack_28a4;
                uVar35 = vmovmskps_avx(local_2b40);
                uVar39 = (ulong)(uVar35 ^ 0xff);
                while (uVar39 != 0) {
                  lVar41 = 0;
                  for (uVar38 = uVar39; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000
                      ) {
                    lVar41 = lVar41 + 1;
                  }
                  uVar39 = uVar39 - 1 & uVar39;
                  cVar32 = (**(code **)((long)pvVar8 + (ulong)bVar5 * 0x40 + 0x28))
                                     (&local_27c0,ray,lVar41,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  auVar102 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  uVar38 = extraout_RDX;
                  if (cVar32 != '\0') {
                    local_2b20[lVar41] = 0xffffffff;
                  }
                }
                auVar25._8_4_ = local_2b20[2];
                auVar25._12_4_ = local_2b20[3];
                auVar25._0_4_ = local_2b20[0];
                auVar25._4_4_ = local_2b20[1];
                auVar25._16_4_ = local_2b20[4];
                auVar25._20_4_ = local_2b20[5];
                auVar25._24_4_ = local_2b20[6];
                auVar25._28_4_ = local_2b20[7];
                local_2b40 = vorps_avx(auVar61,auVar25);
                auVar61 = _DAT_01f7b020 & ~local_2b40;
                if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar61 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar61 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar61 >> 0x7f,0) == '\0') &&
                      (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar61 >> 0xbf,0) == '\0') &&
                    (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar61[0x1f]) goto LAB_015cbea3;
                auVar52 = ZEXT3264(local_2900);
                auVar60._8_4_ = 0xff800000;
                auVar60._0_8_ = 0xff800000ff800000;
                auVar60._12_4_ = 0xff800000;
                auVar60._16_4_ = 0xff800000;
                auVar60._20_4_ = 0xff800000;
                auVar60._24_4_ = 0xff800000;
                auVar60._28_4_ = 0xff800000;
                local_2900 = vblendvps_avx(local_2900,auVar60,local_2b40);
              }
              goto LAB_015cb6f2;
            }
            uVar38 = root.ptr & 0xfffffffffffffff0;
            uVar35 = (uint)root.ptr & 7;
            local_2880 = vcmpps_avx(local_2900,auVar104._0_32_,6);
            auVar61 = auVar102._0_32_;
            root.ptr = 8;
            for (; (auVar104 = ZEXT3264(auVar61), uVar39 != 0 &&
                   (uVar7 = *(ulong *)(uVar38 + 0x20 + uVar39 * 2), uVar7 != 8));
                uVar39 = uVar39 + 4) {
              if ((uVar35 == 6) || (uVar35 == 1)) {
                uVar37 = *(undefined4 *)(uVar38 + 0x90 + uVar39);
                auVar45._4_4_ = uVar37;
                auVar45._0_4_ = uVar37;
                auVar45._8_4_ = uVar37;
                auVar45._12_4_ = uVar37;
                auVar45._16_4_ = uVar37;
                auVar45._20_4_ = uVar37;
                auVar45._24_4_ = uVar37;
                auVar45._28_4_ = uVar37;
                uVar37 = *(undefined4 *)(uVar38 + 0x30 + uVar39);
                auVar62._4_4_ = uVar37;
                auVar62._0_4_ = uVar37;
                auVar62._8_4_ = uVar37;
                auVar62._12_4_ = uVar37;
                auVar62._16_4_ = uVar37;
                auVar62._20_4_ = uVar37;
                auVar62._24_4_ = uVar37;
                auVar62._28_4_ = uVar37;
                auVar55 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar37 = *(undefined4 *)(uVar38 + 0xb0 + uVar39);
                auVar56._4_4_ = uVar37;
                auVar56._0_4_ = uVar37;
                auVar56._8_4_ = uVar37;
                auVar56._12_4_ = uVar37;
                auVar56._16_4_ = uVar37;
                auVar56._20_4_ = uVar37;
                auVar56._24_4_ = uVar37;
                auVar56._28_4_ = uVar37;
                auVar44 = vfmadd231ps_fma(auVar62,auVar55,auVar45);
                uVar37 = *(undefined4 *)(uVar38 + 0x50 + uVar39);
                auVar46._4_4_ = uVar37;
                auVar46._0_4_ = uVar37;
                auVar46._8_4_ = uVar37;
                auVar46._12_4_ = uVar37;
                auVar46._16_4_ = uVar37;
                auVar46._20_4_ = uVar37;
                auVar46._24_4_ = uVar37;
                auVar46._28_4_ = uVar37;
                auVar49 = vfmadd231ps_fma(auVar46,auVar55,auVar56);
                uVar37 = *(undefined4 *)(uVar38 + 0xd0 + uVar39);
                auVar57._4_4_ = uVar37;
                auVar57._0_4_ = uVar37;
                auVar57._8_4_ = uVar37;
                auVar57._12_4_ = uVar37;
                auVar57._16_4_ = uVar37;
                auVar57._20_4_ = uVar37;
                auVar57._24_4_ = uVar37;
                auVar57._28_4_ = uVar37;
                uVar37 = *(undefined4 *)(uVar38 + 0x70 + uVar39);
                auVar65._4_4_ = uVar37;
                auVar65._0_4_ = uVar37;
                auVar65._8_4_ = uVar37;
                auVar65._12_4_ = uVar37;
                auVar65._16_4_ = uVar37;
                auVar65._20_4_ = uVar37;
                auVar65._24_4_ = uVar37;
                auVar65._28_4_ = uVar37;
                uVar37 = *(undefined4 *)(uVar38 + 0xa0 + uVar39);
                auVar75._4_4_ = uVar37;
                auVar75._0_4_ = uVar37;
                auVar75._8_4_ = uVar37;
                auVar75._12_4_ = uVar37;
                auVar75._16_4_ = uVar37;
                auVar75._20_4_ = uVar37;
                auVar75._24_4_ = uVar37;
                auVar75._28_4_ = uVar37;
                uVar37 = *(undefined4 *)(uVar38 + 0x40 + uVar39);
                auVar72._4_4_ = uVar37;
                auVar72._0_4_ = uVar37;
                auVar72._8_4_ = uVar37;
                auVar72._12_4_ = uVar37;
                auVar72._16_4_ = uVar37;
                auVar72._20_4_ = uVar37;
                auVar72._24_4_ = uVar37;
                auVar72._28_4_ = uVar37;
                auVar69 = vfmadd231ps_fma(auVar65,auVar55,auVar57);
                auVar88 = vfmadd231ps_fma(auVar72,auVar55,auVar75);
                uVar37 = *(undefined4 *)(uVar38 + 0xc0 + uVar39);
                auVar58._4_4_ = uVar37;
                auVar58._0_4_ = uVar37;
                auVar58._8_4_ = uVar37;
                auVar58._12_4_ = uVar37;
                auVar58._16_4_ = uVar37;
                auVar58._20_4_ = uVar37;
                auVar58._24_4_ = uVar37;
                auVar58._28_4_ = uVar37;
                uVar37 = *(undefined4 *)(uVar38 + 0x60 + uVar39);
                auVar76._4_4_ = uVar37;
                auVar76._0_4_ = uVar37;
                auVar76._8_4_ = uVar37;
                auVar76._12_4_ = uVar37;
                auVar76._16_4_ = uVar37;
                auVar76._20_4_ = uVar37;
                auVar76._24_4_ = uVar37;
                auVar76._28_4_ = uVar37;
                uVar37 = *(undefined4 *)(uVar38 + 0xe0 + uVar39);
                auVar85._4_4_ = uVar37;
                auVar85._0_4_ = uVar37;
                auVar85._8_4_ = uVar37;
                auVar85._12_4_ = uVar37;
                auVar85._16_4_ = uVar37;
                auVar85._20_4_ = uVar37;
                auVar85._24_4_ = uVar37;
                auVar85._28_4_ = uVar37;
                auVar97 = vfmadd231ps_fma(auVar76,auVar55,auVar58);
                uVar37 = *(undefined4 *)(uVar38 + 0x80 + uVar39);
                auVar86._4_4_ = uVar37;
                auVar86._0_4_ = uVar37;
                auVar86._8_4_ = uVar37;
                auVar86._12_4_ = uVar37;
                auVar86._16_4_ = uVar37;
                auVar86._20_4_ = uVar37;
                auVar86._24_4_ = uVar37;
                auVar86._28_4_ = uVar37;
                auVar94 = vfmadd231ps_fma(auVar86,auVar55,auVar85);
                auVar28._4_4_ = fStack_29dc;
                auVar28._0_4_ = local_29e0;
                auVar28._8_4_ = fStack_29d8;
                auVar28._12_4_ = fStack_29d4;
                auVar28._16_4_ = fStack_29d0;
                auVar28._20_4_ = fStack_29cc;
                auVar28._24_4_ = fStack_29c8;
                auVar28._28_4_ = uStack_29c4;
                auVar44 = vfmsub213ps_fma(ZEXT1632(auVar44),local_2a40,auVar28);
                auVar29._4_4_ = fStack_29bc;
                auVar29._0_4_ = local_29c0;
                auVar29._8_4_ = fStack_29b8;
                auVar29._12_4_ = fStack_29b4;
                auVar29._16_4_ = fStack_29b0;
                auVar29._20_4_ = fStack_29ac;
                auVar29._24_4_ = fStack_29a8;
                auVar29._28_4_ = uStack_29a4;
                auVar49 = vfmsub213ps_fma(ZEXT1632(auVar49),local_2a20,auVar29);
                auVar30._4_4_ = fStack_299c;
                auVar30._0_4_ = local_29a0;
                auVar30._8_4_ = fStack_2998;
                auVar30._12_4_ = fStack_2994;
                auVar30._16_4_ = fStack_2990;
                auVar30._20_4_ = fStack_298c;
                auVar30._24_4_ = fStack_2988;
                auVar30._28_4_ = uStack_2984;
                auVar69 = vfmsub213ps_fma(ZEXT1632(auVar69),local_2a00,auVar30);
                auVar88 = vfmsub213ps_fma(ZEXT1632(auVar88),local_2a40,auVar28);
                auVar97 = vfmsub213ps_fma(ZEXT1632(auVar97),local_2a20,auVar29);
                auVar94 = vfmsub213ps_fma(ZEXT1632(auVar94),local_2a00,auVar30);
                auVar48 = vpminsd_avx2(ZEXT1632(auVar44),ZEXT1632(auVar88));
                auVar84 = vpminsd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar97));
                auVar48 = vpmaxsd_avx2(auVar48,auVar84);
                auVar84 = vpminsd_avx2(ZEXT1632(auVar69),ZEXT1632(auVar94));
                auVar84 = vpmaxsd_avx2(auVar48,auVar84);
                auVar48 = vpmaxsd_avx2(ZEXT1632(auVar44),ZEXT1632(auVar88));
                auVar53 = vpmaxsd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar97));
                auVar53 = vpminsd_avx2(auVar48,auVar53);
                auVar48 = vpmaxsd_avx2(ZEXT1632(auVar69),ZEXT1632(auVar94));
                auVar53 = vpminsd_avx2(auVar53,auVar48);
                auVar48 = vpmaxsd_avx2(auVar84,local_2920);
                auVar53 = vpminsd_avx2(auVar53,local_2900);
                auVar48 = vcmpps_avx(auVar48,auVar53,2);
                if (uVar35 != 6) goto LAB_015cbc05;
                uVar37 = *(undefined4 *)(uVar38 + 0xf0 + uVar39);
                auVar63._4_4_ = uVar37;
                auVar63._0_4_ = uVar37;
                auVar63._8_4_ = uVar37;
                auVar63._12_4_ = uVar37;
                auVar63._16_4_ = uVar37;
                auVar63._20_4_ = uVar37;
                auVar63._24_4_ = uVar37;
                auVar63._28_4_ = uVar37;
                auVar53 = vcmpps_avx(auVar63,auVar55,2);
                uVar37 = *(undefined4 *)(uVar38 + 0x100 + uVar39);
                auVar66._4_4_ = uVar37;
                auVar66._0_4_ = uVar37;
                auVar66._8_4_ = uVar37;
                auVar66._12_4_ = uVar37;
                auVar66._16_4_ = uVar37;
                auVar66._20_4_ = uVar37;
                auVar66._24_4_ = uVar37;
                auVar66._28_4_ = uVar37;
                auVar55 = vcmpps_avx(auVar55,auVar66,1);
                auVar55 = vandps_avx(auVar53,auVar55);
                auVar55 = vandps_avx(auVar55,auVar48);
                auVar44 = auVar55._0_16_;
                auVar49 = auVar55._16_16_;
              }
              else {
                uVar37 = *(undefined4 *)(uVar38 + 0x30 + uVar39);
                uVar1 = *(undefined4 *)(uVar38 + 0x40 + uVar39);
                local_2bc0._4_4_ = *(undefined4 *)(uVar38 + 0x50 + uVar39);
                local_2bc0._0_4_ = local_2bc0._4_4_;
                local_2bc0._8_4_ = local_2bc0._4_4_;
                local_2bc0._12_4_ = local_2bc0._4_4_;
                local_2bc0._16_4_ = local_2bc0._4_4_;
                local_2bc0._20_4_ = local_2bc0._4_4_;
                local_2bc0._24_4_ = local_2bc0._4_4_;
                local_2bc0._28_4_ = local_2bc0._4_4_;
                uVar2 = *(undefined4 *)(uVar38 + 0x60 + uVar39);
                auVar89._4_4_ = uVar2;
                auVar89._0_4_ = uVar2;
                auVar89._8_4_ = uVar2;
                auVar89._12_4_ = uVar2;
                auVar89._16_4_ = uVar2;
                auVar89._20_4_ = uVar2;
                auVar89._24_4_ = uVar2;
                auVar89._28_4_ = uVar2;
                uVar3 = *(undefined4 *)(uVar38 + 0x70 + uVar39);
                auVar87._4_4_ = uVar3;
                auVar87._0_4_ = uVar3;
                auVar87._8_4_ = uVar3;
                auVar87._12_4_ = uVar3;
                auVar87._16_4_ = uVar3;
                auVar87._20_4_ = uVar3;
                auVar87._24_4_ = uVar3;
                auVar87._28_4_ = uVar3;
                uVar3 = *(undefined4 *)(uVar38 + 0x80 + uVar39);
                auVar73._4_4_ = uVar3;
                auVar73._0_4_ = uVar3;
                auVar73._8_4_ = uVar3;
                auVar73._12_4_ = uVar3;
                auVar73._16_4_ = uVar3;
                auVar73._20_4_ = uVar3;
                auVar73._24_4_ = uVar3;
                auVar73._28_4_ = uVar3;
                fVar74 = *(float *)(uVar38 + 0x90 + uVar39);
                auVar101._4_4_ = fVar74;
                auVar101._0_4_ = fVar74;
                auVar101._8_4_ = fVar74;
                auVar101._12_4_ = fVar74;
                auVar101._16_4_ = fVar74;
                auVar101._20_4_ = fVar74;
                auVar101._24_4_ = fVar74;
                auVar101._28_4_ = fVar74;
                fVar78 = *(float *)(uVar38 + 0xa0 + uVar39);
                auVar103._4_4_ = fVar78;
                auVar103._0_4_ = fVar78;
                auVar103._8_4_ = fVar78;
                auVar103._12_4_ = fVar78;
                auVar103._16_4_ = fVar78;
                auVar103._20_4_ = fVar78;
                auVar103._24_4_ = fVar78;
                auVar103._28_4_ = fVar78;
                fVar79 = *(float *)(uVar38 + 0xb0 + uVar39);
                auVar105._4_4_ = fVar79;
                auVar105._0_4_ = fVar79;
                auVar105._8_4_ = fVar79;
                auVar105._12_4_ = fVar79;
                auVar105._16_4_ = fVar79;
                auVar105._20_4_ = fVar79;
                auVar105._24_4_ = fVar79;
                auVar105._28_4_ = fVar79;
                uVar4 = *(undefined4 *)(uVar38 + 0xc0 + uVar39);
                auVar77._4_4_ = uVar4;
                auVar77._0_4_ = uVar4;
                auVar77._8_4_ = uVar4;
                auVar77._12_4_ = uVar4;
                auVar77._16_4_ = uVar4;
                auVar77._20_4_ = uVar4;
                auVar77._24_4_ = uVar4;
                auVar77._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(uVar38 + 0xd0 + uVar39);
                auVar59._4_4_ = uVar4;
                auVar59._0_4_ = uVar4;
                auVar59._8_4_ = uVar4;
                auVar59._12_4_ = uVar4;
                auVar59._16_4_ = uVar4;
                auVar59._20_4_ = uVar4;
                auVar59._24_4_ = uVar4;
                auVar59._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(uVar38 + 0xe0 + uVar39);
                auVar67._4_4_ = uVar4;
                auVar67._0_4_ = uVar4;
                auVar67._8_4_ = uVar4;
                auVar67._12_4_ = uVar4;
                auVar67._16_4_ = uVar4;
                auVar67._20_4_ = uVar4;
                auVar67._24_4_ = uVar4;
                auVar67._28_4_ = uVar4;
                fVar80 = *(float *)(uVar38 + 0xf0 + uVar39);
                fVar81 = *(float *)(uVar38 + 0x100 + uVar39);
                fVar82 = *(float *)(uVar38 + 0x110 + uVar39);
                auVar44 = vfmadd231ps_fma(auVar77,(undefined1  [32])local_2b00.field_0.z.field_0,
                                          auVar101);
                auVar49 = vfmadd231ps_fma(auVar59,(undefined1  [32])local_2b00.field_0.z.field_0,
                                          auVar103);
                auVar69 = vfmadd231ps_fma(auVar67,(undefined1  [32])local_2b00.field_0.z.field_0,
                                          auVar105);
                auVar102._0_4_ = fVar74 * (float)local_2a60._0_4_;
                auVar102._4_4_ = fVar74 * (float)local_2a60._4_4_;
                auVar102._8_4_ = fVar74 * fStack_2a58;
                auVar102._12_4_ = fVar74 * fStack_2a54;
                auVar102._16_4_ = fVar74 * fStack_2a50;
                auVar102._20_4_ = fVar74 * fStack_2a4c;
                auVar102._28_36_ = auVar52._28_36_;
                auVar102._24_4_ = fVar74 * fStack_2a48;
                auVar15._4_4_ = fVar78 * (float)local_2a60._4_4_;
                auVar15._0_4_ = fVar78 * (float)local_2a60._0_4_;
                auVar15._8_4_ = fVar78 * fStack_2a58;
                auVar15._12_4_ = fVar78 * fStack_2a54;
                auVar15._16_4_ = fVar78 * fStack_2a50;
                auVar15._20_4_ = fVar78 * fStack_2a4c;
                auVar15._24_4_ = fVar78 * fStack_2a48;
                auVar15._28_4_ = fVar78;
                auVar16._4_4_ = fVar79 * (float)local_2a60._4_4_;
                auVar16._0_4_ = fVar79 * (float)local_2a60._0_4_;
                auVar16._8_4_ = fVar79 * fStack_2a58;
                auVar16._12_4_ = fVar79 * fStack_2a54;
                auVar16._16_4_ = fVar79 * fStack_2a50;
                auVar16._20_4_ = fVar79 * fStack_2a4c;
                auVar16._24_4_ = fVar79 * fStack_2a48;
                auVar16._28_4_ = fVar74;
                auVar88 = vfmadd231ps_fma(auVar102._0_32_,local_2a80,auVar89);
                auVar97 = vfmadd231ps_fma(auVar15,local_2a80,auVar87);
                auVar94 = vfmadd231ps_fma(auVar16,auVar73,local_2a80);
                auVar27._4_4_ = local_2b00._36_4_;
                auVar27._0_4_ = local_2b00._32_4_;
                auVar27._8_4_ = local_2b00._40_4_;
                auVar27._12_4_ = local_2b00._44_4_;
                auVar27._16_4_ = local_2b00._48_4_;
                auVar27._20_4_ = local_2b00._52_4_;
                auVar27._24_4_ = local_2b00._56_4_;
                auVar27._28_4_ = local_2b00._60_4_;
                auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar27,auVar89);
                fVar74 = *(float *)(uVar38 + 0x120 + uVar39);
                auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar27,auVar87);
                local_2840 = ZEXT1632(auVar49);
                fVar78 = *(float *)(uVar38 + 0x130 + uVar39);
                fVar79 = *(float *)(uVar38 + 0x140 + uVar39);
                auVar49 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar27,auVar73);
                local_2860 = ZEXT1632(auVar49);
                auVar55 = *(undefined1 (*) [32])(ray + 0xe0);
                fVar83 = auVar55._0_4_;
                fVar9 = auVar55._4_4_;
                auVar17._4_4_ = fVar80 * fVar9;
                auVar17._0_4_ = fVar80 * fVar83;
                fVar10 = auVar55._8_4_;
                auVar17._8_4_ = fVar80 * fVar10;
                fVar11 = auVar55._12_4_;
                auVar17._12_4_ = fVar80 * fVar11;
                fVar12 = auVar55._16_4_;
                auVar17._16_4_ = fVar80 * fVar12;
                fVar13 = auVar55._20_4_;
                auVar17._20_4_ = fVar80 * fVar13;
                fVar14 = auVar55._24_4_;
                auVar17._24_4_ = fVar80 * fVar14;
                auVar17._28_4_ = uVar2;
                auVar18._4_4_ = fVar81 * fVar9;
                auVar18._0_4_ = fVar81 * fVar83;
                auVar18._8_4_ = fVar81 * fVar10;
                auVar18._12_4_ = fVar81 * fVar11;
                auVar18._16_4_ = fVar81 * fVar12;
                auVar18._20_4_ = fVar81 * fVar13;
                auVar18._24_4_ = fVar81 * fVar14;
                auVar18._28_4_ = uVar3;
                auVar68._0_4_ = fVar82 * fVar83;
                auVar68._4_4_ = fVar82 * fVar9;
                auVar68._8_4_ = fVar82 * fVar10;
                auVar68._12_4_ = fVar82 * fVar11;
                auVar68._16_4_ = fVar82 * fVar12;
                auVar68._20_4_ = fVar82 * fVar13;
                auVar68._24_4_ = fVar82 * fVar14;
                auVar68._28_4_ = 0;
                auVar96._8_4_ = 0x3f800000;
                auVar96._0_8_ = 0x3f8000003f800000;
                auVar96._12_4_ = 0x3f800000;
                auVar96._16_4_ = 0x3f800000;
                auVar96._20_4_ = 0x3f800000;
                auVar96._24_4_ = 0x3f800000;
                auVar96._28_4_ = 0x3f800000;
                auVar55 = vsubps_avx(auVar96,auVar55);
                auVar48 = ZEXT1232(ZEXT412(0)) << 0x20;
                auVar95 = vfmadd231ps_fma(auVar17,auVar55,auVar48);
                auVar49 = vfmadd231ps_fma(auVar18,auVar55,auVar48);
                local_2820 = ZEXT1632(auVar49);
                auVar49 = vfmadd231ps_fma(auVar68,auVar55,ZEXT1232(ZEXT412(0)) << 0x20);
                local_27e0 = ZEXT1632(auVar49);
                local_2800 = auVar55._0_4_;
                auVar93._0_4_ = fVar74 * fVar83 + local_2800;
                fStack_27fc = auVar55._4_4_;
                auVar93._4_4_ = fVar74 * fVar9 + fStack_27fc;
                fStack_27f8 = auVar55._8_4_;
                auVar93._8_4_ = fVar74 * fVar10 + fStack_27f8;
                fStack_27f4 = auVar55._12_4_;
                auVar93._12_4_ = fVar74 * fVar11 + fStack_27f4;
                fStack_27f0 = auVar55._16_4_;
                auVar93._16_4_ = fVar74 * fVar12 + fStack_27f0;
                fStack_27ec = auVar55._20_4_;
                auVar93._20_4_ = fVar74 * fVar13 + fStack_27ec;
                fStack_27e8 = auVar55._24_4_;
                auVar93._24_4_ = fVar74 * fVar14 + fStack_27e8;
                fStack_27e4 = auVar55._28_4_;
                auVar93._28_4_ = fVar80 + fStack_27e4;
                auVar98._0_4_ = local_2800 + fVar83 * fVar78;
                auVar98._4_4_ = fStack_27fc + fVar9 * fVar78;
                auVar98._8_4_ = fStack_27f8 + fVar10 * fVar78;
                auVar98._12_4_ = fStack_27f4 + fVar11 * fVar78;
                auVar98._16_4_ = fStack_27f0 + fVar12 * fVar78;
                auVar98._20_4_ = fStack_27ec + fVar13 * fVar78;
                auVar98._24_4_ = fStack_27e8 + fVar14 * fVar78;
                auVar98._28_4_ = fStack_27e4 + fVar78;
                local_2800 = local_2800 + fVar83 * fVar79;
                fStack_27fc = fStack_27fc + fVar9 * fVar79;
                fStack_27f8 = fStack_27f8 + fVar10 * fVar79;
                fStack_27f4 = fStack_27f4 + fVar11 * fVar79;
                fStack_27f0 = fStack_27f0 + fVar12 * fVar79;
                fStack_27ec = fStack_27ec + fVar13 * fVar79;
                fStack_27e8 = fStack_27e8 + fVar14 * fVar79;
                fStack_27e4 = fStack_27e4 + fVar79;
                auVar23._4_4_ = uVar37;
                auVar23._0_4_ = uVar37;
                auVar23._8_4_ = uVar37;
                auVar23._12_4_ = uVar37;
                auVar23._16_4_ = uVar37;
                auVar23._20_4_ = uVar37;
                auVar23._24_4_ = uVar37;
                auVar23._28_4_ = uVar37;
                auVar49 = vfmadd231ps_fma(ZEXT1632(auVar88),local_2aa0,auVar23);
                auVar24._4_4_ = uVar1;
                auVar24._0_4_ = uVar1;
                auVar24._8_4_ = uVar1;
                auVar24._12_4_ = uVar1;
                auVar24._16_4_ = uVar1;
                auVar24._20_4_ = uVar1;
                auVar24._24_4_ = uVar1;
                auVar24._28_4_ = uVar1;
                auVar69 = vfmadd231ps_fma(ZEXT1632(auVar97),local_2aa0,auVar24);
                auVar88 = vfmadd231ps_fma(ZEXT1632(auVar94),local_2bc0,local_2aa0);
                auVar55 = vandps_avx(ZEXT1632(auVar49),local_28a0);
                auVar106._8_4_ = 0x219392ef;
                auVar106._0_8_ = 0x219392ef219392ef;
                auVar106._12_4_ = 0x219392ef;
                auVar106._16_4_ = 0x219392ef;
                auVar106._20_4_ = 0x219392ef;
                auVar106._24_4_ = 0x219392ef;
                auVar106._28_4_ = 0x219392ef;
                auVar55 = vcmpps_avx(auVar55,auVar106,1);
                auVar48 = vblendvps_avx(ZEXT1632(auVar49),auVar106,auVar55);
                auVar55 = vandps_avx(ZEXT1632(auVar69),local_28a0);
                auVar55 = vcmpps_avx(auVar55,auVar106,1);
                auVar84 = vblendvps_avx(ZEXT1632(auVar69),auVar106,auVar55);
                auVar26._4_4_ = local_2b00._4_4_;
                auVar26._0_4_ = local_2b00._0_4_;
                auVar26._8_4_ = local_2b00._8_4_;
                auVar26._12_4_ = local_2b00._12_4_;
                auVar26._16_4_ = local_2b00._16_4_;
                auVar26._20_4_ = local_2b00._20_4_;
                auVar26._24_4_ = local_2b00._24_4_;
                auVar26._28_4_ = local_2b00._28_4_;
                auVar97 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar26,auVar23);
                auVar94 = vfmadd231ps_fma(local_2840,auVar26,auVar24);
                auVar90 = vfmadd231ps_fma(local_2860,auVar26,local_2bc0);
                auVar55 = vandps_avx(ZEXT1632(auVar88),local_28a0);
                auVar55 = vcmpps_avx(auVar55,auVar106,1);
                auVar53 = vrcpps_avx(auVar48);
                auVar55 = vblendvps_avx(ZEXT1632(auVar88),auVar106,auVar55);
                auVar102 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar44 = vfnmadd213ps_fma(auVar48,auVar53,auVar96);
                auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar53,auVar53);
                auVar48 = vrcpps_avx(auVar84);
                auVar49 = vfnmadd213ps_fma(auVar84,auVar48,auVar96);
                auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar48,auVar48);
                auVar48 = vrcpps_avx(auVar55);
                auVar69 = vfnmadd213ps_fma(auVar55,auVar48,auVar96);
                auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar48,auVar48);
                auVar55 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar97));
                auVar48 = vsubps_avx(auVar93,ZEXT1632(auVar97));
                auVar19._4_4_ = auVar44._4_4_ * auVar55._4_4_;
                auVar19._0_4_ = auVar44._0_4_ * auVar55._0_4_;
                auVar19._8_4_ = auVar44._8_4_ * auVar55._8_4_;
                auVar19._12_4_ = auVar44._12_4_ * auVar55._12_4_;
                auVar19._16_4_ = auVar55._16_4_ * 0.0;
                auVar19._20_4_ = auVar55._20_4_ * 0.0;
                auVar19._24_4_ = auVar55._24_4_ * 0.0;
                auVar19._28_4_ = auVar55._28_4_;
                auVar47._0_4_ = auVar44._0_4_ * auVar48._0_4_;
                auVar47._4_4_ = auVar44._4_4_ * auVar48._4_4_;
                auVar47._8_4_ = auVar44._8_4_ * auVar48._8_4_;
                auVar47._12_4_ = auVar44._12_4_ * auVar48._12_4_;
                auVar47._16_4_ = auVar48._16_4_ * 0.0;
                auVar47._20_4_ = auVar48._20_4_ * 0.0;
                auVar47._24_4_ = auVar48._24_4_ * 0.0;
                auVar47._28_4_ = 0;
                auVar55 = vsubps_avx(local_2820,ZEXT1632(auVar94));
                auVar48 = vsubps_avx(auVar98,ZEXT1632(auVar94));
                auVar20._4_4_ = auVar49._4_4_ * auVar55._4_4_;
                auVar20._0_4_ = auVar49._0_4_ * auVar55._0_4_;
                auVar20._8_4_ = auVar49._8_4_ * auVar55._8_4_;
                auVar20._12_4_ = auVar49._12_4_ * auVar55._12_4_;
                auVar20._16_4_ = auVar55._16_4_ * 0.0;
                auVar20._20_4_ = auVar55._20_4_ * 0.0;
                auVar20._24_4_ = auVar55._24_4_ * 0.0;
                auVar20._28_4_ = auVar55._28_4_;
                auVar50._0_4_ = auVar49._0_4_ * auVar48._0_4_;
                auVar50._4_4_ = auVar49._4_4_ * auVar48._4_4_;
                auVar50._8_4_ = auVar49._8_4_ * auVar48._8_4_;
                auVar50._12_4_ = auVar49._12_4_ * auVar48._12_4_;
                auVar50._16_4_ = auVar48._16_4_ * 0.0;
                auVar50._20_4_ = auVar48._20_4_ * 0.0;
                auVar50._24_4_ = auVar48._24_4_ * 0.0;
                auVar50._28_4_ = 0;
                auVar55 = vsubps_avx(local_27e0,ZEXT1632(auVar90));
                auVar21._4_4_ = auVar69._4_4_ * auVar55._4_4_;
                auVar21._0_4_ = auVar69._0_4_ * auVar55._0_4_;
                auVar21._8_4_ = auVar69._8_4_ * auVar55._8_4_;
                auVar21._12_4_ = auVar69._12_4_ * auVar55._12_4_;
                auVar21._16_4_ = auVar55._16_4_ * 0.0;
                auVar21._20_4_ = auVar55._20_4_ * 0.0;
                auVar21._24_4_ = auVar55._24_4_ * 0.0;
                auVar21._28_4_ = auVar55._28_4_;
                auVar31._4_4_ = fStack_27fc;
                auVar31._0_4_ = local_2800;
                auVar31._8_4_ = fStack_27f8;
                auVar31._12_4_ = fStack_27f4;
                auVar31._16_4_ = fStack_27f0;
                auVar31._20_4_ = fStack_27ec;
                auVar31._24_4_ = fStack_27e8;
                auVar31._28_4_ = fStack_27e4;
                auVar55 = vsubps_avx(auVar31,ZEXT1632(auVar90));
                auVar22._4_4_ = auVar69._4_4_ * auVar55._4_4_;
                auVar22._0_4_ = auVar69._0_4_ * auVar55._0_4_;
                auVar22._8_4_ = auVar69._8_4_ * auVar55._8_4_;
                auVar22._12_4_ = auVar69._12_4_ * auVar55._12_4_;
                auVar22._16_4_ = auVar55._16_4_ * 0.0;
                auVar22._20_4_ = auVar55._20_4_ * 0.0;
                auVar22._24_4_ = auVar55._24_4_ * 0.0;
                auVar22._28_4_ = auVar55._28_4_;
                auVar55 = vpminsd_avx2(auVar19,auVar47);
                auVar48 = vpminsd_avx2(auVar20,auVar50);
                auVar55 = vpmaxsd_avx2(auVar55,auVar48);
                auVar48 = vpminsd_avx2(auVar21,auVar22);
                auVar84 = vpmaxsd_avx2(auVar55,auVar48);
                auVar55 = vpmaxsd_avx2(auVar19,auVar47);
                auVar48 = vpmaxsd_avx2(auVar20,auVar50);
                auVar48 = vpminsd_avx2(auVar55,auVar48);
                auVar55 = vpmaxsd_avx2(auVar21,auVar22);
                auVar48 = vpminsd_avx2(auVar48,auVar55);
                auVar55 = vpmaxsd_avx2(auVar84,local_2920);
                auVar48 = vpminsd_avx2(auVar48,local_2900);
                auVar48 = vcmpps_avx(auVar55,auVar48,2);
LAB_015cbc05:
                auVar44 = auVar48._0_16_;
                auVar49 = auVar48._16_16_;
              }
              auVar44 = vpackssdw_avx(auVar44,auVar49);
              auVar49 = vpackssdw_avx(local_2880._0_16_,local_2880._16_16_);
              auVar52 = ZEXT1664(auVar49);
              auVar44 = vpand_avx(auVar44,auVar49);
              auVar55 = vpmovzxwd_avx2(auVar44);
              auVar48 = vpslld_avx2(auVar55,0x1f);
              uVar42 = root.ptr;
              auVar55 = auVar61;
              if (((((((((auVar48 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar48 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar48 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar48 >> 0x7f,0) != '\0') ||
                     (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar48 >> 0xbf,0) != '\0') ||
                   (auVar48 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar48[0x1f] < '\0') &&
                 (auVar55 = vblendvps_avx(auVar102._0_32_,auVar84,auVar48), uVar42 = uVar7,
                 root.ptr != 8)) {
                *puVar40 = root.ptr;
                puVar40 = puVar40 + 1;
                *pauVar43 = auVar61;
                pauVar43 = pauVar43 + 1;
              }
              auVar61 = auVar55;
              root.ptr = uVar42;
            }
            uVar38 = uVar39;
            if (root.ptr == 8) goto LAB_015cbc99;
            auVar55 = vcmpps_avx(local_2900,auVar61,6);
            uVar37 = vmovmskps_avx(auVar55);
          } while ((byte)uVar36 < (byte)POPCOUNT(uVar37));
          *puVar40 = root.ptr;
          puVar40 = puVar40 + 1;
          *pauVar43 = auVar61;
          pauVar43 = pauVar43 + 1;
LAB_015cbc99:
          iVar34 = 4;
        }
        else {
          while (uVar38 != 0) {
            sVar6 = 0;
            for (uVar39 = uVar38; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
              sVar6 = sVar6 + 1;
            }
            uVar38 = uVar38 - 1 & uVar38;
            auVar52 = ZEXT1664(auVar52._0_16_);
            bVar33 = occluded1(This,bvh,root,sVar6,(Precalculations *)&local_27c0,ray,
                               (TravRayK<8,_false> *)&local_2b00.field_0,context);
            if (bVar33) {
              *(undefined4 *)(local_2b40 + sVar6 * 4) = 0xffffffff;
            }
          }
          auVar55 = _DAT_01f7b020 & ~local_2b40;
          iVar34 = 3;
          auVar102 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar104 = ZEXT3264(auVar61);
          if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar55 >> 0x7f,0) != '\0') ||
                (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar55 >> 0xbf,0) != '\0') ||
              (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar55[0x1f] < '\0') {
            auVar52 = ZEXT3264(local_2900);
            auVar61._8_4_ = 0xff800000;
            auVar61._0_8_ = 0xff800000ff800000;
            auVar61._12_4_ = 0xff800000;
            auVar61._16_4_ = 0xff800000;
            auVar61._20_4_ = 0xff800000;
            auVar61._24_4_ = 0xff800000;
            auVar61._28_4_ = 0xff800000;
            local_2900 = vblendvps_avx(local_2900,auVar61,local_2b40);
            iVar34 = 2;
          }
          uVar38 = 0;
          if (uVar36 < (uint)POPCOUNT(uVar37)) goto LAB_015cb72f;
          uVar38 = 0;
        }
      } while (iVar34 != 3);
LAB_015cbea3:
      auVar61 = vandps_avx(local_28e0,local_2b40);
      auVar51._8_4_ = 0xff800000;
      auVar51._0_8_ = 0xff800000ff800000;
      auVar51._12_4_ = 0xff800000;
      auVar51._16_4_ = 0xff800000;
      auVar51._20_4_ = 0xff800000;
      auVar51._24_4_ = 0xff800000;
      auVar51._28_4_ = 0xff800000;
      auVar61 = vmaskmovps_avx(auVar61,auVar51);
      *(undefined1 (*) [32])(ray + 0x100) = auVar61;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }